

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdExpandNode_rec(Kit_DsdNtk_t *pNew,Kit_DsdNtk_t *p,int iLit)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  Kit_DsdObj_t KVar5;
  Kit_DsdObj_t *pKVar6;
  Kit_DsdObj_t *pKVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  uint *pTruth;
  bool bVar11;
  uint nLitsNew;
  uint piLitsNew [16];
  int local_84;
  ulong local_80;
  uint local_78 [18];
  
  local_84 = 0;
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar8 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  if ((uint)p->nNodes + (uint)uVar1 <= uVar8) {
    __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                  ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
  }
  if (uVar8 < uVar1) {
    return iLit;
  }
  pKVar6 = p->pNodes[(ulong)uVar8 - (ulong)uVar1];
  if (pKVar6 == (Kit_DsdObj_t *)0x0) {
    return iLit;
  }
  uVar8 = (uint)*pKVar6 >> 6 & 7;
  if (uVar8 == 5) {
    pKVar7 = Kit_DsdObjAlloc(pNew,KIT_DSD_PRIME,(uint)*pKVar6 >> 0x1a);
    KVar5 = *pKVar6;
    puVar10 = (uint *)((long)&pKVar6[1].field_0x0 + (ulong)((uint)KVar5 >> 8 & 0x3fc));
    if (((uint)KVar5 & 0x1c0) != 0x140) {
      puVar10 = (uint *)0x0;
    }
    pTruth = (uint *)(&pKVar7[1].field_0x0 + ((uint)*pKVar7 >> 8 & 0x3fc));
    if (((uint)*pKVar7 & 0x1c0) != 0x140) {
      pTruth = (uint *)0x0;
    }
    uVar8 = 1 << ((KVar5._3_1_ >> 2) - 5 & 0x1f);
    if ((uint)KVar5 < 0x18000000) {
      uVar8 = 1;
    }
    if (0 < (int)uVar8) {
      uVar9 = (ulong)uVar8 + 1;
      do {
        pTruth[uVar9 - 2] = puVar10[uVar9 - 2];
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
      KVar5 = *pKVar6;
    }
    uVar8 = (uint)KVar5 >> 0x1a;
    bVar11 = true;
    uVar9 = (ulong)(uint)iLit;
    if (0x3ffffff < (uint)KVar5) {
      uVar9 = 0;
      local_80 = (ulong)(uint)iLit;
      do {
        uVar8 = Kit_DsdExpandNode_rec
                          (pNew,p,(uint)*(ushort *)((long)&pKVar6[1].field_0x0 + uVar9 * 2));
        *(ushort *)(&pKVar7[1].field_0x0 + uVar9 * 2) = (ushort)uVar8;
        if ((uVar8 & 1) != 0) {
          *(ushort *)(&pKVar7[1].field_0x0 + uVar9 * 2) = (ushort)uVar8 & 0xfffe;
          Kit_TruthChangePhase(pTruth,(uint)*pKVar7 >> 0x1a,(int)uVar9);
        }
        uVar9 = uVar9 + 1;
        uVar8 = (uint)*pKVar6 >> 0x1a;
      } while (uVar9 < uVar8);
      bVar11 = (uint)*pKVar6 < 0x18000000;
      uVar9 = local_80;
    }
    iLit = (int)uVar9;
    if (uVar8 != 3) {
LAB_005daabf:
      if ((uVar9 & 1) != 0) {
        uVar8 = 1 << ((char)uVar8 - 5U & 0x1f);
        if (bVar11) {
          uVar8 = 1;
        }
        if (0 < (int)uVar8) {
          uVar9 = (ulong)uVar8 + 1;
          do {
            pTruth[uVar9 - 2] = ~pTruth[uVar9 - 2];
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
        }
      }
      return (int)*pKVar7 * 2 & 0x7e;
    }
    pKVar6 = pKVar7 + 1;
    uVar2 = *pTruth;
    if ((int)uVar2 < 0x35353535) {
      if (uVar2 == 0xc5c5c5c5) {
        *(byte *)pKVar6 = *(byte *)pKVar6 ^ 1;
      }
      else if (uVar2 != 0xcacacaca) goto LAB_005daabf;
    }
    else if (uVar2 == 0x35353535) {
      *pKVar6 = (Kit_DsdObj_t)((uint)*pKVar6 ^ 0x10001);
    }
    else {
      if (uVar2 != 0x3a3a3a3a) goto LAB_005daabf;
      pKVar7[1].field_0x2 = pKVar7[1].field_0x2 ^ 1;
    }
    *pTruth = 0xcacacaca;
    uVar1 = *(ushort *)(pKVar7 + 2);
    if ((uVar1 & 1) == 0) {
      uVar3 = *(ushort *)&pKVar7[1].field_0x2;
    }
    else {
      uVar3 = (ushort)*(byte *)(pKVar7 + 1);
      *(undefined2 *)(pKVar7 + 1) = *(undefined2 *)&pKVar7[1].field_0x2;
      *(ushort *)&pKVar7[1].field_0x2 = uVar3;
      *(ushort *)(pKVar7 + 2) = uVar1 & 0xfffe;
    }
    if ((uVar3 & 1) != 0) {
      *(byte *)(pKVar7 + 1) = *(byte *)(pKVar7 + 1) ^ 1;
      iLit = iLit ^ 1;
      *(ushort *)&pKVar7[1].field_0x2 = uVar3 & 0xfffe;
    }
    if (iLit < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    KVar5 = *pKVar7;
  }
  else {
    if (uVar8 == 4) {
      uVar8 = iLit & 1;
      Kit_DsdExpandCollectXor_rec(p,iLit & 0x7ffffffe,local_78,&local_84);
      pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_XOR,local_84);
      KVar5 = *pKVar6;
      if (0x3ffffff < (uint)KVar5) {
        uVar9 = 0;
        do {
          uVar2 = local_78[uVar9];
          if ((int)uVar2 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x133,"int Abc_LitRegular(int)");
          }
          iVar4 = Kit_DsdExpandNode_rec(pNew,p,uVar2 & 0x7ffffffe);
          *(short *)(&pKVar6[1].field_0x0 + uVar9 * 2) = (short)iVar4;
          uVar8 = uVar8 ^ uVar2 & 1;
          uVar9 = uVar9 + 1;
          KVar5 = *pKVar6;
        } while (uVar9 < (uint)KVar5 >> 0x1a);
      }
      return uVar8 + ((uint)KVar5 & 0x3f) * 2;
    }
    if (uVar8 != 3) {
      __assert_fail("pObj->Type == KIT_DSD_PRIME",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                    ,0x564,"int Kit_DsdExpandNode_rec(Kit_DsdNtk_t *, Kit_DsdNtk_t *, int)");
    }
    Kit_DsdExpandCollectAnd_rec(p,iLit & 0x7ffffffe,local_78,&local_84);
    pKVar6 = Kit_DsdObjAlloc(pNew,KIT_DSD_AND,local_84);
    KVar5 = *pKVar6;
    if (0x3ffffff < (uint)KVar5) {
      uVar9 = 0;
      do {
        iVar4 = Kit_DsdExpandNode_rec(pNew,p,local_78[uVar9]);
        *(short *)(&pKVar6[1].field_0x0 + uVar9 * 2) = (short)iVar4;
        uVar9 = uVar9 + 1;
        KVar5 = *pKVar6;
      } while (uVar9 < (uint)KVar5 >> 0x1a);
    }
  }
  return (iLit & 1U) + ((uint)KVar5 & 0x3f) * 2;
}

Assistant:

int Kit_DsdExpandNode_rec( Kit_DsdNtk_t * pNew, Kit_DsdNtk_t * p, int iLit )
{
    unsigned * pTruth, * pTruthNew;
    unsigned i, iLitFanin, piLitsNew[16], nLitsNew = 0;
    Kit_DsdObj_t * pObj, * pObjNew;

    // consider the case of simple gate
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return iLit;
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_DsdExpandCollectAnd_rec( p, Abc_LitRegular(iLit), piLitsNew, (int *)&nLitsNew );
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_AND, nLitsNew );
        for ( i = 0; i < pObjNew->nFans; i++ )
            pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, piLitsNew[i] );
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        int fCompl = Abc_LitIsCompl(iLit);
        Kit_DsdExpandCollectXor_rec( p, Abc_LitRegular(iLit), piLitsNew, (int *)&nLitsNew );
        pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_XOR, nLitsNew );
        for ( i = 0; i < pObjNew->nFans; i++ )
        {
            pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, Abc_LitRegular(piLitsNew[i]) );
            fCompl ^= Abc_LitIsCompl(piLitsNew[i]);
        }
        return Abc_Var2Lit( pObjNew->Id, fCompl );
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    // create new PRIME node
    pObjNew = Kit_DsdObjAlloc( pNew, KIT_DSD_PRIME, pObj->nFans );
    // copy the truth table
    pTruth = Kit_DsdObjTruth( pObj );
    pTruthNew = Kit_DsdObjTruth( pObjNew );
    Kit_TruthCopy( pTruthNew, pTruth, pObj->nFans );
    // create fanins
    Kit_DsdObjForEachFanin( pNtk, pObj, iLitFanin, i )
    {
        pObjNew->pFans[i] = Kit_DsdExpandNode_rec( pNew, p, iLitFanin );
        // complement the corresponding inputs of the truth table
        if ( Abc_LitIsCompl(pObjNew->pFans[i]) )
        {
            pObjNew->pFans[i] = Abc_LitRegular(pObjNew->pFans[i]);
            Kit_TruthChangePhase( pTruthNew, pObjNew->nFans, i );
        }
    }

    if ( pObj->nFans == 3 && 
        (pTruthNew[0] == 0xCACACACA || pTruthNew[0] == 0xC5C5C5C5 || 
         pTruthNew[0] == 0x3A3A3A3A || pTruthNew[0] == 0x35353535) )
    {
        // translate into regular MUXes
        if ( pTruthNew[0] == 0xC5C5C5C5 )
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
        else if ( pTruthNew[0] == 0x3A3A3A3A )
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        else if ( pTruthNew[0] == 0x35353535 )
        {
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        }
        pTruthNew[0] = 0xCACACACA;
        // resolve the complemented control input
        if ( Abc_LitIsCompl(pObjNew->pFans[2]) )
        {
            unsigned char Temp = pObjNew->pFans[0];
            pObjNew->pFans[0] = pObjNew->pFans[1];
            pObjNew->pFans[1] = Temp;
            pObjNew->pFans[2] = Abc_LitNot(pObjNew->pFans[2]);
        }
        // resolve the complemented true input
        if ( Abc_LitIsCompl(pObjNew->pFans[1]) )
        {
            iLit = Abc_LitNot(iLit);
            pObjNew->pFans[0] = Abc_LitNot(pObjNew->pFans[0]);
            pObjNew->pFans[1] = Abc_LitNot(pObjNew->pFans[1]);
        }
        return Abc_Var2Lit( pObjNew->Id, Abc_LitIsCompl(iLit) );
    }
    else
    {
        // if the incoming phase is complemented, absorb it into the prime node
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthNew, pTruthNew, pObj->nFans );
        return Abc_Var2Lit( pObjNew->Id, 0 );
    }
}